

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_echo_server.cpp
# Opt level: O2

void __thiscall EchoServer::onConnection(EchoServer *this,TcpConnectionPtr *conn)

{
  self *psVar1;
  char *str;
  SourceFile file;
  Logger local_1038;
  undefined1 local_68 [12];
  string local_58;
  string local_38;
  
  if (sznet::g_logLevel < 1) {
    sznet::Logger::SourceFile::SourceFile<115>
              ((SourceFile *)local_68,
               (char (*) [115])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/echo/tcp_echo/tcp_echo_server.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_68._0_8_;
    file.m_size = local_68._8_4_;
    sznet::Logger::Logger(&local_1038,file,0x41,TRACE,"onConnection");
    sznet::net::InetAddress::toIpPort_abi_cxx11_
              (&local_58,
               &((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_peerAddr);
    psVar1 = sznet::LogStream::operator<<(&local_1038.m_impl.m_stream,&local_58);
    psVar1 = sznet::LogStream::operator<<(psVar1," -> ");
    sznet::net::InetAddress::toIpPort_abi_cxx11_
              (&local_38,
               &((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_localAddr);
    psVar1 = sznet::LogStream::operator<<(psVar1,&local_38);
    psVar1 = sznet::LogStream::operator<<(psVar1," is ");
    str = "DOWN";
    if (((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        m_state == kConnected) {
      str = "UP";
    }
    sznet::LogStream::operator<<(psVar1,str);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    sznet::Logger::~Logger(&local_1038);
  }
  sznet::net::TcpConnection::setTcpNoDelay
            ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,true);
  return;
}

Assistant:

void onConnection(const TcpConnectionPtr& conn)
    {
        LOG_TRACE << conn->peerAddress().toIpPort() << " -> "
            << conn->localAddress().toIpPort() << " is "
            << (conn->connected() ? "UP" : "DOWN");
        conn->setTcpNoDelay(true);
    }